

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O3

void __thiscall Holding::PrintHolding(Holding *this)

{
  Holding *pHVar1;
  Holding *pHVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  string *psVar6;
  long lVar7;
  long *plVar8;
  char *pcVar9;
  Holding **ppHVar10;
  Holding **ppHVar11;
  
  plVar8 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card: ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
  iVar3 = (*(this->super_BlackCard).super_Card._vptr_Card[4])(this);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Holding Type: ",0xe);
  switch(this->typeH) {
  case PLAIN:
    pcVar9 = "Plain";
    goto LAB_0010c711;
  case MINE:
    pcVar9 = "Mine";
    lVar7 = 4;
    break;
  case GOLD_MINE:
    pcVar9 = "Gold Mine";
    lVar7 = 9;
    break;
  case CRYSTAL_MINE:
    pcVar9 = "Crystal Mine";
    lVar7 = 0xc;
    break;
  case FARMS:
    pcVar9 = "Farms";
LAB_0010c711:
    lVar7 = 5;
    break;
  case SOLO:
    pcVar9 = "Gifts and Favour";
    lVar7 = 0x10;
    break;
  default:
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (this->tapped == true) {
    pcVar9 = "Tapped: yes";
    lVar7 = 0xb;
  }
  else {
    pcVar9 = "Tapped: no";
    lVar7 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (this->revealed == true) {
    pcVar9 = "Revealed: yes";
    lVar7 = 0xd;
  }
  else {
    pcVar9 = "Revealed: no";
    lVar7 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Harvest Value: ",0xf);
  iVar3 = (*(this->super_BlackCard).super_Card._vptr_Card[7])(this);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  pHVar1 = this->upperHolding;
  pHVar2 = this->subHolding;
  if (pHVar1 == (Holding *)0x0 && pHVar2 == (Holding *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Holding is not in a chain",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    plVar8 = (long *)std::ostream::flush();
  }
  else {
    ppHVar11 = &this->subHolding;
    if (pHVar1 == (Holding *)0x0) {
      if (pHVar2->subHolding == (Holding *)0x0) {
        plVar5 = &std::cout;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding connected with the subHolding ",0x26);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
        psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar11)->super_BlackCard);
        plVar5 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar6->_M_dataplus)._M_p,
                                    psVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,"and ",4);
        ppHVar11 = &(*ppHVar11)->subHolding;
      }
    }
    else {
      ppHVar10 = &this->upperHolding;
      if (pHVar2 == (Holding *)0x0) {
        if (pHVar1->upperHolding == (Holding *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Holding connected with the upperholding ",0x28);
          plVar5 = &std::cout;
          ppHVar11 = ppHVar10;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
          psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar10)->super_BlackCard);
          plVar5 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&std::cout,(psVar6->_M_dataplus)._M_p,
                                      psVar6->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,"and ",4);
          ppHVar11 = &(*ppHVar10)->upperHolding;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
        psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar11)->super_BlackCard);
        plVar5 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar6->_M_dataplus)._M_p,
                                    psVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,"and ",4);
        ppHVar11 = ppHVar10;
      }
    }
    psVar6 = BlackCard::getName_abi_cxx11_(&(*ppHVar11)->super_BlackCard);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)plVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  return;
}

Assistant:

void Holding::PrintHolding()                  //prints holding's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << getCost() << endl;

    cout << "Holding Type: ";
    if (typeH == PLAIN)
        cout << "Plain" << endl;
    else if (typeH == MINE)
        cout << "Mine" << endl;
    else if (typeH == GOLD_MINE)
        cout << "Gold Mine" << endl;
    else if (typeH == CRYSTAL_MINE)
        cout << "Crystal Mine" << endl;
    else if (typeH == FARMS)
        cout << "Farms" << endl;
    else if (typeH == SOLO)
        cout << "Gifts and Favour" << endl;
    else
        return;

    
    if (tapped)
        cout << "Tapped: yes" << endl;
    else
        cout << "Tapped: no" << endl;

    if (revealed)
        cout << "Revealed: yes" << endl;
    else
        cout << "Revealed: no" << endl;

    cout << "Harvest Value: " << getHarvestValue() << endl;

    if (!upperHolding && !subHolding)
    {
        cout << "Holding is not in a chain" << endl << endl;
        return;
    }
    if (upperHolding && subHolding)
        cout << "Holding in complete chain with "<< subHolding->getName() << "and " << upperHolding->getName() << endl;
    else if (upperHolding)
    {
        if (upperHolding->upperHolding)
            cout << "Holding in complete chain with "<< upperHolding->getName() << "and " << upperHolding->upperHolding->getName() << endl;
        else
            cout << "Holding connected with the upperholding " << upperHolding->getName() << endl;
    }
    else
    {
        if (subHolding->subHolding)
            cout << "Holding in complete chain with "<< subHolding->getName() << "and " << subHolding->subHolding->getName() << endl;
        else
            cout << "Holding connected with the subHolding " << subHolding->getName() << endl;
    }
    cout << endl;
}